

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_header_encoder.c
# Opt level: O2

lzma_ret lzma_block_header_encode(lzma_block *block,uint8_t *out)

{
  long *plVar1;
  lzma_ret lVar2;
  uint32_t uVar3;
  lzma_vli lVar4;
  lzma_filter *plVar5;
  long lVar6;
  byte bVar7;
  uint uVar8;
  size_t out_pos;
  ulong out_size;
  
  lVar4 = lzma_block_unpadded_size(block);
  lVar2 = LZMA_PROG_ERROR;
  if ((lVar4 != 0) && (-2 < (long)block->uncompressed_size)) {
    uVar8 = block->header_size - 4;
    out_size = (ulong)uVar8;
    *out = (uint8_t)(uVar8 >> 2);
    out[1] = '\0';
    out_pos = 2;
    if (block->compressed_size != 0xffffffffffffffff) {
      lVar2 = lzma_vli_encode(block->compressed_size,(size_t *)0x0,out,&out_pos,out_size);
      if (lVar2 != LZMA_OK) {
        return lVar2;
      }
      out[1] = out[1] | 0x40;
    }
    if (block->uncompressed_size != 0xffffffffffffffff) {
      lVar2 = lzma_vli_encode(block->uncompressed_size,(size_t *)0x0,out,&out_pos,out_size);
      if (lVar2 != LZMA_OK) {
        return lVar2;
      }
      out[1] = out[1] | 0x80;
    }
    plVar5 = block->filters;
    lVar2 = LZMA_PROG_ERROR;
    if ((plVar5 != (lzma_filter *)0x0) && (plVar5->id != 0xffffffffffffffff)) {
      bVar7 = 0xff;
      lVar6 = 0;
      do {
        if (lVar6 == 0x40) {
          return LZMA_PROG_ERROR;
        }
        lVar2 = lzma_filter_flags_encode
                          ((lzma_filter *)((long)&plVar5->id + lVar6),out,&out_pos,out_size);
        if (lVar2 != LZMA_OK) {
          return lVar2;
        }
        plVar5 = block->filters;
        bVar7 = bVar7 + 1;
        plVar1 = (long *)((long)&plVar5[1].id + lVar6);
        lVar6 = lVar6 + 0x10;
      } while (*plVar1 != -1);
      out[1] = out[1] | bVar7;
      lVar2 = LZMA_OK;
      memset(out + out_pos,0,out_size - out_pos);
      uVar3 = lzma_crc32(out,out_size,0);
      *(uint32_t *)(out + out_size) = uVar3;
    }
  }
  return lVar2;
}

Assistant:

extern LZMA_API(lzma_ret)
lzma_block_header_encode(const lzma_block *block, uint8_t *out)
{
	// Validate everything but filters.
	if (lzma_block_unpadded_size(block) == 0
			|| !lzma_vli_is_valid(block->uncompressed_size))
		return LZMA_PROG_ERROR;

	// Indicate the size of the buffer _excluding_ the CRC32 field.
	const size_t out_size = block->header_size - 4;

	// Store the Block Header Size.
	out[0] = out_size / 4;

	// We write Block Flags in pieces.
	out[1] = 0x00;
	size_t out_pos = 2;

	// Compressed Size
	if (block->compressed_size != LZMA_VLI_UNKNOWN) {
		return_if_error(lzma_vli_encode(block->compressed_size, NULL,
				out, &out_pos, out_size));

		out[1] |= 0x40;
	}

	// Uncompressed Size
	if (block->uncompressed_size != LZMA_VLI_UNKNOWN) {
		return_if_error(lzma_vli_encode(block->uncompressed_size, NULL,
				out, &out_pos, out_size));

		out[1] |= 0x80;
	}

	// Filter Flags
	if (block->filters == NULL || block->filters[0].id == LZMA_VLI_UNKNOWN)
		return LZMA_PROG_ERROR;

	size_t filter_count = 0;
	do {
		// There can be a maximum of four filters.
		if (filter_count == LZMA_FILTERS_MAX)
			return LZMA_PROG_ERROR;

		return_if_error(lzma_filter_flags_encode(
				block->filters + filter_count,
				out, &out_pos, out_size));

	} while (block->filters[++filter_count].id != LZMA_VLI_UNKNOWN);

	out[1] |= filter_count - 1;

	// Padding
	memzero(out + out_pos, out_size - out_pos);

	// CRC32
	write32le(out + out_size, lzma_crc32(out, out_size, 0));

	return LZMA_OK;
}